

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageBlock
          (Parser *this,DescriptorProto *message,LocationRecorder *message_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  bool bVar2;
  Type *pTVar3;
  Type *pTVar4;
  int i;
  int iVar5;
  int32_t iVar6;
  int i_1;
  allocator local_51;
  string local_50;
  
  bVar1 = ConsumeEndOfDeclaration(this,"{",message_location);
  if (bVar1) {
    while (bVar1 = TryConsumeEndOfDeclaration(this,"}",(LocationRecorder *)0x0), !bVar1) {
      if ((this->input_->current_).type == TYPE_END) {
        std::__cxx11::string::string
                  ((string *)&local_50,"Reached end of input in message definition (missing \'}\')."
                   ,&local_51);
        AddError(this,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        goto LAB_003501c4;
      }
      bVar1 = ParseMessageStatement(this,message,message_location,containing_file);
      if (!bVar1) {
        SkipStatement(this);
      }
    }
    if (0 < (message->extension_range_).super_RepeatedPtrFieldBase.current_size_) {
      bVar1 = anon_unknown_0::IsMessageSetWireFormatMessage(message);
      iVar6 = 0x20000000;
      if (bVar1) {
        iVar6 = 0x7fffffff;
      }
      for (iVar5 = 0; iVar5 < (message->extension_range_).super_RepeatedPtrFieldBase.current_size_;
          iVar5 = iVar5 + 1) {
        pTVar3 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                           (&(message->extension_range_).super_RepeatedPtrFieldBase,iVar5);
        if (pTVar3->end_ == -1) {
          pTVar3 = internal::RepeatedPtrFieldBase::
                   Mutable<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                             (&(message->extension_range_).super_RepeatedPtrFieldBase,iVar5);
          *(byte *)(pTVar3->_has_bits_).has_bits_ = (byte)(pTVar3->_has_bits_).has_bits_[0] | 4;
          pTVar3->end_ = iVar6;
        }
      }
    }
    bVar1 = true;
    if (0 < (message->reserved_range_).super_RepeatedPtrFieldBase.current_size_) {
      bVar2 = anon_unknown_0::IsMessageSetWireFormatMessage(message);
      iVar6 = 0x20000000;
      if (bVar2) {
        iVar6 = 0x7fffffff;
      }
      for (iVar5 = 0; iVar5 < (message->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
          iVar5 = iVar5 + 1) {
        pTVar4 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::TypeHandler>
                           (&(message->reserved_range_).super_RepeatedPtrFieldBase,iVar5);
        if (pTVar4->end_ == -1) {
          pTVar4 = internal::RepeatedPtrFieldBase::
                   Mutable<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::TypeHandler>
                             (&(message->reserved_range_).super_RepeatedPtrFieldBase,iVar5);
          *(byte *)(pTVar4->_has_bits_).has_bits_ = (byte)(pTVar4->_has_bits_).has_bits_[0] | 2;
          pTVar4->end_ = iVar6;
        }
      }
    }
  }
  else {
LAB_003501c4:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Parser::ParseMessageBlock(DescriptorProto* message,
                               const LocationRecorder& message_location,
                               const FileDescriptorProto* containing_file) {
  DO(ConsumeEndOfDeclaration("{", &message_location));

  while (!TryConsumeEndOfDeclaration("}", NULL)) {
    if (AtEnd()) {
      AddError("Reached end of input in message definition (missing '}').");
      return false;
    }

    if (!ParseMessageStatement(message, message_location, containing_file)) {
      // This statement failed to parse.  Skip it, but keep looping to parse
      // other statements.
      SkipStatement();
    }
  }

  if (message->extension_range_size() > 0) {
    AdjustExtensionRangesWithMaxEndNumber(message);
  }
  if (message->reserved_range_size() > 0) {
    AdjustReservedRangesWithMaxEndNumber(message);
  }
  return true;
}